

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int32_t nghttp2_submit_headers
                  (nghttp2_session *session,uint8_t flags,int32_t stream_id,
                  nghttp2_priority_spec *pri_spec,nghttp2_nv *nva,size_t nvlen,
                  void *stream_user_data)

{
  int iVar1;
  int32_t iVar2;
  int rv;
  size_t nvlen_local;
  nghttp2_nv *nva_local;
  nghttp2_priority_spec *pri_spec_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  if (stream_id == -1) {
    if (session->server != '\0') {
      return -0x1f9;
    }
  }
  else if (stream_id < 1) {
    return -0x1f5;
  }
  pri_spec_local._7_1_ = flags & 1;
  if (((pri_spec == (nghttp2_priority_spec *)0x0) ||
      (iVar1 = nghttp2_priority_spec_check_default(pri_spec), iVar1 != 0)) ||
     ((session->remote_settings).no_rfc7540_priorities == 1)) {
    nva_local = (nghttp2_nv *)0x0;
  }
  else {
    iVar1 = detect_self_dependency(session,stream_id,pri_spec);
    if (iVar1 != 0) {
      return iVar1;
    }
    pri_spec_local._7_1_ = pri_spec_local._7_1_ | 0x20;
    nva_local = (nghttp2_nv *)pri_spec;
  }
  iVar2 = submit_headers_shared_nva
                    (session,pri_spec_local._7_1_,stream_id,(nghttp2_priority_spec *)nva_local,nva,
                     nvlen,(nghttp2_data_provider *)0x0,stream_user_data);
  return iVar2;
}

Assistant:

int32_t nghttp2_submit_headers(nghttp2_session *session, uint8_t flags,
                               int32_t stream_id,
                               const nghttp2_priority_spec *pri_spec,
                               const nghttp2_nv *nva, size_t nvlen,
                               void *stream_user_data) {
  int rv;

  if (stream_id == -1) {
    if (session->server) {
      return NGHTTP2_ERR_PROTO;
    }
  } else if (stream_id <= 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  flags &= NGHTTP2_FLAG_END_STREAM;

  if (pri_spec && !nghttp2_priority_spec_check_default(pri_spec) &&
      session->remote_settings.no_rfc7540_priorities != 1) {
    rv = detect_self_dependency(session, stream_id, pri_spec);
    if (rv != 0) {
      return rv;
    }

    flags |= NGHTTP2_FLAG_PRIORITY;
  } else {
    pri_spec = NULL;
  }

  return submit_headers_shared_nva(session, flags, stream_id, pri_spec, nva,
                                   nvlen, NULL, stream_user_data);
}